

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventAgentTest.cpp
# Opt level: O3

void __thiscall
TestClass::SyncFunc4(TestClass *this,uint64_t *p1,uint32_t *p2,uint16_t *p3,uint8_t *p4)

{
  SyncEventAgent *this_00;
  void *__buf;
  int __flags;
  
  __flags = (int)p4;
  this_00 = (SyncEventAgent *)
            operator_new(0x50,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/eventAgentTest.cpp"
                         ,0xa1);
  *(undefined8 *)&(this_00->super_EventAgent).super_Event.super_RefCount.mRefCount =
       0xfffffffb00000000;
  (this_00->super_EventAgent).super_Event.mPriority = 0;
  (this_00->super_EventAgent).super_Event.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR_onRefCountZero_0010f7c0;
  this_00[1].super_EventAgent.super_Event.super_RefCount._vptr_RefCount = (_func_int **)this;
  *(code **)&this_00[1].super_EventAgent.super_Event.super_RefCount.mRefCount = handleSyncFunc4;
  *(undefined8 *)&this_00[1].super_EventAgent.super_Event.mPriority = 0;
  this_00[2].super_EventAgent.super_Event.super_RefCount._vptr_RefCount = (_func_int **)p1;
  *(uint32_t **)&this_00[2].super_EventAgent.super_Event.super_RefCount.mRefCount = p2;
  *(uint16_t **)&this_00[2].super_EventAgent.super_Event.mPriority = p3;
  this_00[3].super_EventAgent.super_Event.super_RefCount._vptr_RefCount = (_func_int **)p4;
  SyncEventAgent::send(this_00,(int)this + 8,__buf,0x10b080,__flags);
  return;
}

Assistant:

void SyncFunc4(uint64_t &p1, uint32_t &p2, uint16_t &p3, uint8_t &p4)
	{
		SyncEventAgent4<TestClass, uint64_t &, uint32_t &, uint16_t &, uint8_t &> *agent =
			jh_new SyncEventAgent4<TestClass, uint64_t &, uint32_t &, uint16_t &, uint8_t &>(this, &TestClass::handleSyncFunc4,
			p1, p2, p3, p4);
		agent->send(&mEventThread);
		LOG_INFO("Sync4 result %llu, %u, %u, %u", p1, p2, p3, p4);
	}